

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::OpenPopupEx(ImGuiID id)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiPopupRef *pIVar6;
  ImGuiContext *pIVar7;
  ImVec2 *pIVar8;
  ImGuiPopupRef *__dest;
  int iVar9;
  int iVar10;
  ImGuiContext *ctx;
  ImVec2 local_58;
  uint local_4c;
  ImVec2 local_48;
  ImGuiPopupRef *local_40;
  ulong local_38;
  
  pIVar7 = GImGui;
  pIVar8 = &local_58;
  pIVar5 = GImGui->CurrentWindow;
  iVar2 = (GImGui->BeginPopupStack).Size;
  local_58.x = 0.0;
  local_58.y = 0.0;
  uVar3 = GImGui->FrameCount;
  local_4c = (pIVar5->IDStack).Data[(long)(pIVar5->IDStack).Size + -1];
  local_58 = NavCalcPreferredRefPos();
  if ((-256000.0 <= (pIVar7->IO).MousePos.x) &&
     (pIVar8 = &local_58, -256000.0 <= (pIVar7->IO).MousePos.y)) {
    pIVar8 = &(pIVar7->IO).MousePos;
  }
  local_48 = *pIVar8;
  iVar4 = (pIVar7->OpenPopupStack).Size;
  if (iVar2 < iVar4) {
    pIVar6 = (pIVar7->OpenPopupStack).Data;
    if ((pIVar6[iVar2].PopupId == id) && (pIVar6[iVar2].OpenFrameCount == uVar3 - 1)) {
      pIVar6[iVar2].OpenFrameCount = uVar3;
    }
    else {
      iVar10 = iVar2 + 1;
      iVar4 = (pIVar7->OpenPopupStack).Capacity;
      local_38._0_4_ = uVar3;
      if (iVar4 <= iVar2) {
        if (iVar4 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar4 / 2 + iVar4;
        }
        if (iVar9 <= iVar10) {
          iVar9 = iVar10;
        }
        if (iVar4 < iVar9) {
          if (pIVar7 != (ImGuiContext *)0x0) {
            piVar1 = &(pIVar7->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          local_38 = (ulong)uVar3;
          local_40 = (ImGuiPopupRef *)
                     (*GImAllocatorAllocFunc)((long)iVar9 * 0x30,GImAllocatorUserData);
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if (pIVar6 != (ImGuiPopupRef *)0x0) {
            memcpy(local_40,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x30);
            pIVar6 = (pIVar7->OpenPopupStack).Data;
            if ((pIVar6 != (ImGuiPopupRef *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
          }
          (pIVar7->OpenPopupStack).Data = local_40;
          (pIVar7->OpenPopupStack).Capacity = iVar9;
        }
      }
      (pIVar7->OpenPopupStack).Size = iVar10;
      pIVar6 = (pIVar7->OpenPopupStack).Data;
      pIVar6[iVar2].PopupId = id;
      pIVar6[iVar2].Window = (ImGuiWindow *)0x0;
      pIVar6[iVar2].ParentWindow = pIVar5;
      pIVar6[iVar2].OpenFrameCount = (uint)local_38;
      pIVar6[iVar2].OpenParentId = local_4c;
      pIVar6[iVar2].OpenPopupPos = local_58;
      pIVar6[iVar2].OpenMousePos = local_48;
    }
  }
  else {
    iVar2 = (pIVar7->OpenPopupStack).Capacity;
    if (iVar4 == iVar2) {
      if (iVar2 == 0) {
        iVar10 = 8;
      }
      else {
        iVar10 = iVar2 / 2 + iVar2;
      }
      iVar9 = iVar4 + 1;
      if (iVar4 + 1 < iVar10) {
        iVar9 = iVar10;
      }
      if (iVar2 < iVar9) {
        if (pIVar7 != (ImGuiContext *)0x0) {
          piVar1 = &(pIVar7->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)((long)iVar9 * 0x30,GImAllocatorUserData);
        pIVar6 = (pIVar7->OpenPopupStack).Data;
        if (pIVar6 != (ImGuiPopupRef *)0x0) {
          memcpy(__dest,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x30);
          pIVar6 = (pIVar7->OpenPopupStack).Data;
          if ((pIVar6 != (ImGuiPopupRef *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
        }
        (pIVar7->OpenPopupStack).Data = __dest;
        (pIVar7->OpenPopupStack).Capacity = iVar9;
      }
    }
    pIVar6 = (pIVar7->OpenPopupStack).Data;
    iVar2 = (pIVar7->OpenPopupStack).Size;
    pIVar6[iVar2].PopupId = id;
    pIVar6[iVar2].Window = (ImGuiWindow *)0x0;
    pIVar6[iVar2].ParentWindow = pIVar5;
    pIVar6[iVar2].OpenFrameCount = uVar3;
    pIVar6[iVar2].OpenParentId = local_4c;
    pIVar6[iVar2].OpenPopupPos = local_58;
    pIVar6[iVar2].OpenMousePos = local_48;
    (pIVar7->OpenPopupStack).Size = (pIVar7->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    int current_stack_size = g.BeginPopupStack.Size;
    ImGuiPopupRef popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.ParentWindow = parent_window;
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    //IMGUI_DEBUG_LOG("OpenPopupEx(0x%08X)\n", g.FrameCount, id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            g.OpenPopupStack.resize(current_stack_size + 1);
            g.OpenPopupStack[current_stack_size] = popup_ref;
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}